

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::startThreads(FastText *this,TrainCallback *callback)

{
  exception_ptr *this_00;
  long lVar1;
  int iVar2;
  rep rVar3;
  long *plVar4;
  int64_t iVar5;
  undefined8 uVar6;
  pointer *__ptr;
  int iVar7;
  int32_t i;
  ulong uVar8;
  exception_ptr local_98;
  thread local_90;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_68 [8];
  exception_ptr exception;
  function<void_(float,_float,_double,_double,_long)> local_50;
  
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar3;
  this_00 = &this->trainException_;
  iVar7 = 0;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  exception._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::operator=(this_00,&exception);
  std::__exception_ptr::exception_ptr::~exception_ptr(&exception);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thread;
  if (iVar2 < 2) {
    trainThread(this,0,callback);
  }
  else {
    for (; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      exception._M_exception_object = this;
      std::function<void_(float,_float,_double,_double,_long)>::function(&local_50,callback);
      local_90._M_id._M_thread = (id)0;
      plVar4 = (long *)operator_new(0x38);
      *plVar4 = (long)&PTR___State_impl_0015b8b0;
      plVar4[1] = (long)exception._M_exception_object;
      *(int *)(plVar4 + 2) = iVar7;
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)(plVar4 + 3),&local_50);
      local_98._M_exception_object = plVar4;
      std::thread::_M_start_thread(&local_90,&local_98,0);
      if ((long *)local_98._M_exception_object != (long *)0x0) {
        (**(code **)(*local_98._M_exception_object + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&threads,&local_90);
      std::thread::~thread(&local_90);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      iVar2 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->thread;
    }
  }
  iVar5 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  while (((this->tokenCount_).super___atomic_base<long>._M_i <
          ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          epoch * iVar5 && ((this->trainException_)._M_exception_object == (void *)0x0))) {
    exception._M_exception_object = (void *)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&exception);
    if ((0.0 <= (this->loss_)._M_i) &&
       (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose)) {
      lVar1 = (this->tokenCount_).super___atomic_base<long>._M_i;
      iVar2 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->epoch;
      std::operator<<((ostream *)&std::cerr,"\r");
      printInfo(this,(float)lVar1 / (float)(iVar2 * iVar5),(this->loss_)._M_i,(ostream *)&std::cerr)
      ;
    }
  }
  for (uVar8 = 0;
      uVar8 < (ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    std::thread::join();
  }
  if (this_00->_M_exception_object == (void *)0x0) {
    if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose) {
      std::operator<<((ostream *)&std::cerr,"\r");
      printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    return;
  }
  std::__exception_ptr::exception_ptr::exception_ptr(&exception,this_00);
  local_98._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::operator=(this_00,&local_98);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_98);
  std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_68,&exception);
  uVar6 = std::rethrow_exception((exception_ptr)local_68);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  _Unwind_Resume(uVar6);
}

Assistant:

void FastText::startThreads(const TrainCallback& callback) {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  if (args_->thread > 1) {
    for (int32_t i = 0; i < args_->thread; i++) {
      threads.push_back(std::thread([=]() { trainThread(i, callback); }));
    }
  } else {
    // webassembly can't instantiate `std::thread`
    trainThread(0, callback);
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < threads.size(); i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}